

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles2::Functional::eval_faceForward_vec2(ShaderEvalContext *c)

{
  undefined8 uVar1;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  Vector<float,_2> local_30;
  tcu local_28 [8];
  VecAccess<float,_4,_2> local_20;
  
  local_30.m_data[1] = c->in[0].m_data[1];
  local_30.m_data[0] = c->in[0].m_data[3];
  uVar1 = *(undefined8 *)c->in[1].m_data;
  local_38.m_data[1] = (float)uVar1;
  local_38.m_data[0] = (float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(c->in[2].m_data + 1);
  local_40.m_data[1] = (float)uVar1;
  local_40.m_data[0] = (float)((ulong)uVar1 >> 0x20);
  tcu::faceForward<float,2>(local_28,&local_30,&local_38,&local_40);
  local_20.m_vector = &c->color;
  local_20.m_index[0] = 1;
  local_20.m_index[1] = 2;
  tcu::VecAccess<float,_4,_2>::operator=(&local_20,(Vector<float,_2> *)local_28);
  return;
}

Assistant:

void eval_refract_float	(ShaderEvalContext& c) { c.color.x()	= refract(c.in[0].z(),                 c.in[1].x(),                 c.in[2].y()); }